

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

void __thiscall
kratos::EnumPort::EnumPort
          (EnumPort *this,Generator *m,PortDirection direction,string *name,
          shared_ptr<kratos::Enum> *enum_type)

{
  uint32_t width;
  element_type *this_00;
  element_type *peVar1;
  shared_ptr<kratos::Enum> *enum_type_local;
  string *name_local;
  PortDirection direction_local;
  Generator *m_local;
  EnumPort *this_local;
  
  this_00 = std::__shared_ptr_access<kratos::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)enum_type);
  width = Enum::width(this_00);
  Port::Port(&this->super_Port,m,direction,name,width,1,Data,false);
  EnumType::EnumType(&this->super_EnumType);
  (this->super_Port).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_00590970;
  (this->super_EnumType)._vptr_EnumType = (_func_int **)&DAT_00590ae8;
  peVar1 = std::__shared_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>::get
                     (&enum_type->super___shared_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>);
  this->enum_type_ = peVar1;
  return;
}

Assistant:

EnumPort::EnumPort(kratos::Generator* m, kratos::PortDirection direction, const std::string& name,
                   const std::shared_ptr<Enum>& enum_type)
    : Port(m, direction, name, enum_type->width(), 1, PortType::Data, false),
      enum_type_(enum_type.get()) {}